

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int sftp_fstat(LIBSSH2_SFTP_HANDLE *handle,LIBSSH2_SFTP_ATTRIBUTES *attrs,int setstat)

{
  size_t sVar1;
  uchar uVar2;
  int iVar3;
  uint32_t uVar4;
  ssize_t sVar5;
  ulong uVar6;
  char *errmsg;
  int local_7c;
  uint32_t retcode;
  ssize_t rc;
  uchar *data;
  uchar *s;
  size_t sStack_48;
  uint32_t packet_len;
  size_t data_len;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SFTP *sftp;
  LIBSSH2_SFTP_ATTRIBUTES *pLStack_20;
  int setstat_local;
  LIBSSH2_SFTP_ATTRIBUTES *attrs_local;
  LIBSSH2_SFTP_HANDLE *handle_local;
  
  channel = (LIBSSH2_CHANNEL *)handle->sftp;
  session = (LIBSSH2_SESSION *)(channel->node).next;
  data_len = (size_t)session->kex_prefs;
  sStack_48 = 0;
  sVar1 = handle->handle_len;
  sftp._4_4_ = setstat;
  pLStack_20 = attrs;
  attrs_local = (LIBSSH2_SFTP_ATTRIBUTES *)handle;
  if (setstat == 0) {
    local_7c = 0;
  }
  else {
    local_7c = sftp_attrsize(attrs->flags);
  }
  s._4_4_ = (int)sVar1 + 0xd + local_7c;
  rc = 0;
  if (*(int *)(channel->reqPTY_packet + 0x20) == 0) {
    (channel->local).close = '\0';
    (channel->local).eof = '\0';
    (channel->local).extended_data_ignore_mode = '\0';
    (channel->local).field_0x13 = 0;
    data = (uchar *)(**(code **)(data_len + 8))(s._4_4_,data_len);
    *(uchar **)(channel->reqPTY_packet + 0x24) = data;
    if (*(long *)(channel->reqPTY_packet + 0x24) == 0) {
      iVar3 = _libssh2_error((LIBSSH2_SESSION *)data_len,-6,
                             "Unable to allocate memory for FSTAT/FSETSTAT packet");
      return iVar3;
    }
    _libssh2_store_u32(&data,s._4_4_ - 4);
    uVar2 = '\b';
    if (sftp._4_4_ != 0) {
      uVar2 = '\n';
    }
    *data = uVar2;
    iVar3 = *(int *)&(channel->node).prev;
    *(int *)&(channel->node).prev = iVar3 + 1;
    *(int *)(channel->reqPTY_packet + 0x2c) = iVar3;
    data = data + 1;
    _libssh2_store_u32(&data,*(uint32_t *)(channel->reqPTY_packet + 0x2c));
    _libssh2_store_str(&data,(char *)&attrs_local->permissions,attrs_local[5].filesize);
    if (sftp._4_4_ != 0) {
      sVar5 = sftp_attr2bin(data,pLStack_20);
      data = data + sVar5;
    }
    channel->reqPTY_packet[0x20] = '\x02';
    channel->reqPTY_packet[0x21] = '\0';
    channel->reqPTY_packet[0x22] = '\0';
    channel->reqPTY_packet[0x23] = '\0';
  }
  if (*(int *)(channel->reqPTY_packet + 0x20) == 2) {
    uVar6 = _libssh2_channel_write
                      ((LIBSSH2_CHANNEL *)session,0,*(uchar **)(channel->reqPTY_packet + 0x24),
                       (ulong)s._4_4_);
    if (uVar6 == 0xffffffffffffffdb) {
      return -0x25;
    }
    if (s._4_4_ != uVar6) {
      (**(code **)(data_len + 0x18))(*(undefined8 *)(channel->reqPTY_packet + 0x24),data_len);
      channel->reqPTY_packet[0x24] = '\0';
      channel->reqPTY_packet[0x25] = '\0';
      channel->reqPTY_packet[0x26] = '\0';
      channel->reqPTY_packet[0x27] = '\0';
      channel->reqPTY_packet[0x28] = '\0';
      channel->reqPTY_packet[0x29] = '\0';
      channel->reqPTY_packet[0x2a] = '\0';
      channel->reqPTY_packet[0x2b] = '\0';
      channel->reqPTY_packet[0x20] = '\0';
      channel->reqPTY_packet[0x21] = '\0';
      channel->reqPTY_packet[0x22] = '\0';
      channel->reqPTY_packet[0x23] = '\0';
      errmsg = "Unable to send FXP_FSTAT command";
      if (sftp._4_4_ != 0) {
        errmsg = "Unable to send FXP_FSETSTAT";
      }
      iVar3 = _libssh2_error((LIBSSH2_SESSION *)data_len,-7,errmsg);
      return iVar3;
    }
    (**(code **)(data_len + 0x18))(*(undefined8 *)(channel->reqPTY_packet + 0x24),data_len);
    channel->reqPTY_packet[0x24] = '\0';
    channel->reqPTY_packet[0x25] = '\0';
    channel->reqPTY_packet[0x26] = '\0';
    channel->reqPTY_packet[0x27] = '\0';
    channel->reqPTY_packet[0x28] = '\0';
    channel->reqPTY_packet[0x29] = '\0';
    channel->reqPTY_packet[0x2a] = '\0';
    channel->reqPTY_packet[0x2b] = '\0';
    channel->reqPTY_packet[0x20] = '\x03';
    channel->reqPTY_packet[0x21] = '\0';
    channel->reqPTY_packet[0x22] = '\0';
    channel->reqPTY_packet[0x23] = '\0';
  }
  iVar3 = sftp_packet_requirev
                    ((LIBSSH2_SFTP *)channel,2,"ie",*(uint32_t *)(channel->reqPTY_packet + 0x2c),
                     (uchar **)&rc,&stack0xffffffffffffffb8,9);
  if (iVar3 == -0x25) {
    handle_local._4_4_ = -0x25;
  }
  else if (iVar3 == -0x26) {
    if (sStack_48 != 0) {
      (**(code **)(data_len + 0x18))(rc,data_len);
    }
    handle_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"SFTP fstat packet too short");
  }
  else if (iVar3 == 0) {
    channel->reqPTY_packet[0x20] = '\0';
    channel->reqPTY_packet[0x21] = '\0';
    channel->reqPTY_packet[0x22] = '\0';
    channel->reqPTY_packet[0x23] = '\0';
    if (*(char *)rc == 'e') {
      uVar4 = _libssh2_ntohu32((uchar *)(rc + 5));
      (**(code **)(data_len + 0x18))(rc,data_len);
      if (uVar4 == 0) {
        handle_local._4_4_ = 0;
      }
      else {
        (channel->local).close = (char)uVar4;
        (channel->local).eof = (char)(uVar4 >> 8);
        (channel->local).extended_data_ignore_mode = (char)(uVar4 >> 0x10);
        (channel->local).field_0x13 = (char)(uVar4 >> 0x18);
        handle_local._4_4_ = _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"SFTP Protocol Error")
        ;
      }
    }
    else {
      sVar5 = sftp_bin2attr(pLStack_20,(uchar *)(rc + 5),sStack_48 - 5);
      if (sVar5 < 0) {
        (**(code **)(data_len + 0x18))(rc,data_len);
        handle_local._4_4_ =
             _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"Attributes too short in SFTP fstat");
      }
      else {
        (**(code **)(data_len + 0x18))(rc,data_len);
        handle_local._4_4_ = 0;
      }
    }
  }
  else {
    channel->reqPTY_packet[0x20] = '\0';
    channel->reqPTY_packet[0x21] = '\0';
    channel->reqPTY_packet[0x22] = '\0';
    channel->reqPTY_packet[0x23] = '\0';
    handle_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)data_len,iVar3,"Timeout waiting for status message");
  }
  return handle_local._4_4_;
}

Assistant:

static int sftp_fstat(LIBSSH2_SFTP_HANDLE *handle,
                      LIBSSH2_SFTP_ATTRIBUTES *attrs, int setstat)
{
    LIBSSH2_SFTP *sftp = handle->sftp;
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    size_t data_len = 0;
    /* 13 = packet_len(4) + packet_type(1) + request_id(4) + handle_len(4) */
    uint32_t packet_len = (uint32_t)(handle->handle_len + 13 +
                                 (setstat ? sftp_attrsize(attrs->flags) : 0));
    unsigned char *s, *data = NULL;
    static const unsigned char fstat_responses[2] =
        { SSH_FXP_ATTRS, SSH_FXP_STATUS };
    ssize_t rc;

    if(sftp->fstat_state == libssh2_NB_state_idle) {
        sftp->last_errno = LIBSSH2_FX_OK;

        _libssh2_debug((session, LIBSSH2_TRACE_SFTP, "Issuing %s command",
                       setstat ? "set-stat" : "stat"));
        s = sftp->fstat_packet = LIBSSH2_ALLOC(session, packet_len);
        if(!sftp->fstat_packet) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for "
                                  "FSTAT/FSETSTAT packet");
        }

        _libssh2_store_u32(&s, packet_len - 4);
        *(s++) = setstat ? SSH_FXP_FSETSTAT : SSH_FXP_FSTAT;
        sftp->fstat_request_id = sftp->request_id++;
        _libssh2_store_u32(&s, sftp->fstat_request_id);
        _libssh2_store_str(&s, handle->handle, handle->handle_len);

        if(setstat) {
            s += sftp_attr2bin(s, attrs);
        }

        sftp->fstat_state = libssh2_NB_state_created;
    }

    if(sftp->fstat_state == libssh2_NB_state_created) {
        rc = _libssh2_channel_write(channel, 0, sftp->fstat_packet,
                                    packet_len);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return (int)rc;
        }
        else if((ssize_t)packet_len != rc) {
            LIBSSH2_FREE(session, sftp->fstat_packet);
            sftp->fstat_packet = NULL;
            sftp->fstat_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  (setstat ? "Unable to send FXP_FSETSTAT"
                                   : "Unable to send FXP_FSTAT command"));
        }
        LIBSSH2_FREE(session, sftp->fstat_packet);
        sftp->fstat_packet = NULL;

        sftp->fstat_state = libssh2_NB_state_sent;
    }

    rc = sftp_packet_requirev(sftp, 2, fstat_responses,
                              sftp->fstat_request_id, &data,
                              &data_len, 9);
    if(rc == LIBSSH2_ERROR_EAGAIN)
        return (int)rc;
    else if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
        if(data_len > 0) {
            LIBSSH2_FREE(session, data);
        }
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP fstat packet too short");
    }
    else if(rc) {
        sftp->fstat_state = libssh2_NB_state_idle;
        return _libssh2_error(session, (int)rc,
                              "Timeout waiting for status message");
    }

    sftp->fstat_state = libssh2_NB_state_idle;

    if(data[0] == SSH_FXP_STATUS) {
        uint32_t retcode;

        retcode = _libssh2_ntohu32(data + 5);
        LIBSSH2_FREE(session, data);
        if(retcode == LIBSSH2_FX_OK) {
            return 0;
        }
        else {
            sftp->last_errno = retcode;
            return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                  "SFTP Protocol Error");
        }
    }

    if(sftp_bin2attr(attrs, data + 5, data_len - 5) < 0) {
        LIBSSH2_FREE(session, data);
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "Attributes too short in SFTP fstat");
    }

    LIBSSH2_FREE(session, data);

    return 0;
}